

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::PoolingLayerParams::InternalSwap
          (PoolingLayerParams *this,PoolingLayerParams *other)

{
  int iVar1;
  uint32_t uVar2;
  intptr_t iVar3;
  PoolingPaddingTypeUnion PVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  
  iVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar3;
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->kernelsize_,&other->kernelsize_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap(&this->stride_,&other->stride_);
  iVar1 = this->type_;
  this->type_ = other->type_;
  other->type_ = iVar1;
  bVar6 = this->avgpoolexcludepadding_;
  bVar7 = this->globalpooling_;
  bVar5 = other->globalpooling_;
  this->avgpoolexcludepadding_ = other->avgpoolexcludepadding_;
  this->globalpooling_ = bVar5;
  other->avgpoolexcludepadding_ = bVar6;
  other->globalpooling_ = bVar7;
  PVar4 = this->PoolingPaddingType_;
  this->PoolingPaddingType_ = other->PoolingPaddingType_;
  other->PoolingPaddingType_ = PVar4;
  uVar2 = this->_oneof_case_[0];
  this->_oneof_case_[0] = other->_oneof_case_[0];
  other->_oneof_case_[0] = uVar2;
  return;
}

Assistant:

void PoolingLayerParams::InternalSwap(PoolingLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  kernelsize_.InternalSwap(&other->kernelsize_);
  stride_.InternalSwap(&other->stride_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(PoolingLayerParams, globalpooling_)
      + sizeof(PoolingLayerParams::globalpooling_)
      - PROTOBUF_FIELD_OFFSET(PoolingLayerParams, type_)>(
          reinterpret_cast<char*>(&type_),
          reinterpret_cast<char*>(&other->type_));
  swap(PoolingPaddingType_, other->PoolingPaddingType_);
  swap(_oneof_case_[0], other->_oneof_case_[0]);
}